

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SampleRateConverter.cpp
# Opt level: O2

void __thiscall
MT32Emu::SampleRateConverter::getOutputSamples
          (SampleRateConverter *this,Bit16s *outBuffer,uint length)

{
  float *pfVar1;
  uint length_00;
  float fVar2;
  float fVar3;
  float floatBuffer [8192];
  float local_8038 [8194];
  
  if (this->useSynthDelegate != true) {
    for (; length != 0; length = length - length_00) {
      length_00 = 0x1000;
      if (length < 0x1000) {
        length_00 = length;
      }
      getOutputSamples(this,local_8038,length_00);
      pfVar1 = local_8038;
      while (pfVar1 < (float *)((long)local_8038 + (ulong)(length_00 * 8))) {
        fVar2 = *pfVar1;
        pfVar1 = pfVar1 + 1;
        fVar3 = -32768.0;
        if (-32768.0 <= fVar2 * 32768.0) {
          fVar3 = fVar2 * 32768.0;
        }
        fVar2 = 32767.0;
        if (fVar3 <= 32767.0) {
          fVar2 = fVar3;
        }
        *outBuffer = (Bit16s)(int)fVar2;
        outBuffer = outBuffer + 1;
      }
    }
    return;
  }
  Synth::render((Synth *)this->srcDelegate,outBuffer,length);
  return;
}

Assistant:

void SampleRateConverter::getOutputSamples(Bit16s *outBuffer, unsigned int length) {
	static const unsigned int CHANNEL_COUNT = 2;

	if (useSynthDelegate) {
		static_cast<Synth *>(srcDelegate)->render(outBuffer, length);
		return;
	}

	float floatBuffer[CHANNEL_COUNT * MAX_SAMPLES_PER_RUN];
	while (length > 0) {
		const unsigned int size = MAX_SAMPLES_PER_RUN < length ? MAX_SAMPLES_PER_RUN : length;
		getOutputSamples(floatBuffer, size);
		float *outs = floatBuffer;
		float *ends = floatBuffer + CHANNEL_COUNT * size;
		while (outs < ends) {
			*(outBuffer++) = Synth::convertSample(*(outs++));
		}
		length -= size;
	}
}